

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

Nwk_Grf_t * Nwk_ManLutMergeReadGraph(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  Nwk_Grf_t *p;
  int iNode2;
  int iNode1;
  int nEdges;
  int nNodes;
  char Buffer [100];
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined1 local_98 [104];
  
  __stream = fopen(pFileName,"r");
  __isoc99_fscanf(__stream,"%s %d",local_98,&local_9c);
  __isoc99_fscanf(__stream,"%s %d",local_98,&local_a0);
  p = Nwk_ManGraphAlloc(local_9c);
  while( true ) {
    iVar1 = __isoc99_fscanf(__stream,"%s %d %d",local_98,&local_a4,&local_a8);
    if (iVar1 != 3) break;
    Nwk_ManGraphHashEdge(p,local_a4,local_a8);
  }
  if (p->nEdges == local_a0) {
    fclose(__stream);
    return p;
  }
  __assert_fail("p->nEdges == nEdges",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                ,0x2af,"Nwk_Grf_t *Nwk_ManLutMergeReadGraph(char *)");
}

Assistant:

Nwk_Grf_t * Nwk_ManLutMergeReadGraph( char * pFileName )
{
    Nwk_Grf_t * p;
    FILE * pFile;
    char Buffer[100];
    int nNodes, nEdges, iNode1, iNode2;
    int RetValue;
    pFile = fopen( pFileName, "r" );
    RetValue = fscanf( pFile, "%s %d", Buffer, &nNodes );
    RetValue = fscanf( pFile, "%s %d", Buffer, &nEdges );
    p = Nwk_ManGraphAlloc( nNodes );
    while ( fscanf( pFile, "%s %d %d", Buffer, &iNode1, &iNode2 ) == 3 )
        Nwk_ManGraphHashEdge( p, iNode1, iNode2 );
    assert( p->nEdges == nEdges );
    fclose( pFile );
    return p;
}